

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

_Bool golf_geo_generator_data_get_arg
                (golf_geo_generator_data_t *data,char *name,golf_geo_generator_data_arg_t **arg)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  golf_geo_generator_data_arg_t *__s1;
  _Bool _Var4;
  
  uVar2 = (ulong)(data->args).length;
  if ((long)uVar2 < 1) {
LAB_0012b3e0:
    _Var4 = false;
  }
  else {
    __s1 = (data->args).data;
    iVar1 = strcmp(__s1->name,name);
    if (iVar1 == 0) {
      _Var4 = true;
    }
    else {
      uVar3 = 0;
      do {
        if (uVar2 - 1 == uVar3) goto LAB_0012b3e0;
        __s1 = __s1 + 1;
        iVar1 = strcmp(__s1->name,name);
        uVar3 = uVar3 + 1;
      } while (iVar1 != 0);
      _Var4 = uVar3 < uVar2;
    }
    *arg = __s1;
  }
  return _Var4;
}

Assistant:

bool golf_geo_generator_data_get_arg(golf_geo_generator_data_t *data, const char *name, golf_geo_generator_data_arg_t **arg) {
    for (int i = 0; i < data->args.length; i++) {
        if (strcmp(data->args.data[i].name, name) == 0) {
            *arg = &data->args.data[i];
            return true;
        }
    }
    return false;
}